

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O1

void __thiscall ON_FixedSizePool::ReturnAll(ON_FixedSizePool *this)

{
  void *pvVar1;
  ulong uVar2;
  
  pvVar1 = this->m_first_block;
  if (pvVar1 != (void *)0x0) {
    this->m_al_element_stack = (void *)0x0;
    this->m_al_block = pvVar1;
    this->m_al_element_array = (void *)((long)pvVar1 + 0x10);
    if (this->m_sizeof_element == 0) {
      uVar2 = 0;
    }
    else {
      uVar2 = (ulong)(*(long *)((long)pvVar1 + 8) - ((long)pvVar1 + 0x10)) / this->m_sizeof_element;
    }
    this->m_al_count = uVar2;
    this->m_active_element_count = 0;
    this->m_total_element_count = 0;
  }
  return;
}

Assistant:

void ON_FixedSizePool::ReturnAll()
{
  if ( 0 != m_first_block )
  {
    // initialize
    m_al_element_stack = 0;
    //////m_qwerty_it_block = 0;
    //////m_qwerty_it_element = 0;
    m_al_block = m_first_block;
    m_al_element_array = (void*)(((char*)m_al_block) + 2*sizeof(void*));
    m_al_count = BlockElementCapacity(m_first_block);
    m_active_element_count = 0;
    m_total_element_count = 0;
  }
}